

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O1

void addSoftPedalling(MidiFile *midifile,int sourcetrack,int targettrack)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  MidiEventList *pMVar4;
  MidiEvent *pMVar5;
  int index;
  MidiEvent me;
  MidiEvent MStack_68;
  
  iVar2 = smf::MidiFile::getEventCount(midifile,sourcetrack);
  smf::MidiEvent::MidiEvent(&MStack_68);
  MStack_68.track = targettrack;
  if (0 < iVar2) {
    index = 0;
    do {
      pMVar4 = smf::MidiFile::operator[](midifile,sourcetrack);
      pMVar5 = smf::MidiEventList::operator[](pMVar4,index);
      bVar1 = smf::MidiMessage::isNoteOn(&pMVar5->super_MidiMessage);
      if (bVar1) {
        pMVar4 = smf::MidiFile::operator[](midifile,sourcetrack);
        pMVar5 = smf::MidiEventList::operator[](pMVar4,index);
        iVar3 = smf::MidiMessage::getKeyNumber(&pMVar5->super_MidiMessage);
        pMVar4 = smf::MidiFile::operator[](midifile,sourcetrack);
        pMVar5 = smf::MidiEventList::operator[](pMVar4,index);
        MStack_68.tick = pMVar5->tick;
        if (iVar3 == SoftOnKey) {
          smf::MidiMessage::makeController(&MStack_68.super_MidiMessage,1,0x43,0x7f);
          iVar3 = 0x7f;
          smf::MidiFile::addEvent(midifile,&MStack_68);
        }
        else {
          if (iVar3 != SoftOffKey) goto LAB_001124f9;
          smf::MidiMessage::makeController(&MStack_68.super_MidiMessage,1,0x43,0);
          iVar3 = 0;
          smf::MidiFile::addEvent(midifile,&MStack_68);
        }
        smf::MidiMessage::makeController(&MStack_68.super_MidiMessage,2,0x43,iVar3);
        smf::MidiFile::addEvent(midifile,&MStack_68);
      }
LAB_001124f9:
      index = index + 1;
    } while (iVar2 != index);
  }
  smf::MidiEvent::~MidiEvent(&MStack_68);
  return;
}

Assistant:

void addSoftPedalling(MidiFile& midifile, int sourcetrack, int targettrack) {
	int count = midifile.getEventCount(sourcetrack);
	MidiEvent me;
	me.track = targettrack;
	for (int i=0; i<count; i++) {
		if (!midifile[sourcetrack][i].isNoteOn()) {
			continue;
		}
		int key = midifile[sourcetrack][i].getKeyNumber();
		me.tick = midifile[sourcetrack][i].tick;
		if (key == SoftOnKey) {
			me.makeController(1, 67, 127);
			midifile.addEvent(me);
			me.makeController(2, 67, 127);
			midifile.addEvent(me);
		} else if (key == SoftOffKey) {
			me.makeController(1, 67, 0);
			midifile.addEvent(me);
			me.makeController(2, 67, 0);
			midifile.addEvent(me);
		}
	}
}